

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_list.c
# Opt level: O0

prf_node_t * prf_vertex_list_node_create(prf_model_t *model,int numvertices)

{
  prf_node_t *ppVar1;
  int in_ESI;
  prf_model_t *in_RDI;
  prf_node_t *node;
  
  ppVar1 = prf_node_create_etc(in_RDI,(uint16_t)((uint)in_ESI >> 0x10));
  if (ppVar1 != (prf_node_t *)0x0) {
    ppVar1->opcode = 0x48;
    ppVar1->length = (short)(in_ESI << 2) + 4;
  }
  return ppVar1;
}

Assistant:

prf_node_t *
prf_vertex_list_node_create(
    prf_model_t * model,
    int numvertices )
{
    prf_node_t * node =
        prf_node_create_etc( model, (uint16_t) (numvertices * 4) );
    if ( node ) {
        node->opcode = 72;
        node->length = 4 + numvertices * 4;
    }
    return node;
}